

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

void ncnn::im2col_sgemm_pack8to1_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  uint _h;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  int *piVar17;
  ulong uVar18;
  long lVar19;
  void *pvVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  int nn;
  undefined8 *puVar27;
  int iVar28;
  undefined4 *puVar29;
  undefined8 *puVar30;
  uint uVar31;
  uint uVar32;
  undefined4 *puVar33;
  undefined4 *puVar34;
  ulong uVar35;
  undefined4 *puVar36;
  long lVar37;
  Mat local_b8;
  Mat *local_70;
  Mat *local_68;
  undefined1 (*local_60) [16];
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  uVar2 = bottom_im2col->w;
  uVar22 = (ulong)(int)uVar2;
  iVar3 = bottom_im2col->h;
  _h = bottom_im2col->c;
  iVar4 = top_blob->c;
  uVar35 = (ulong)iVar4;
  local_b8.cstep = 0;
  local_b8.elemsize = 0;
  local_b8.elempack = 0;
  local_b8.data = (undefined1 (*) [16])0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  uVar24 = (uVar2 & 1) + (uVar2 >> 1);
  if ((long)uVar22 < 2) {
    uVar24 = uVar2;
  }
  local_70 = top_blob;
  local_68 = kernel;
  Mat::create(&local_b8,iVar3 << (1 < (long)uVar22),_h,uVar24,8,8,opt->workspace_allocator);
  if (0 < (int)uVar2 >> 1) {
    lVar19 = 0;
    uVar23 = 0;
    do {
      if (0 < (int)_h) {
        puVar30 = (undefined8 *)
                  ((undefined1 *)local_b8.data + local_b8.cstep * uVar23 * local_b8.elemsize);
        uVar26 = 0;
        do {
          if (0 < iVar3) {
            puVar27 = (undefined8 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar19);
            iVar28 = iVar3;
            do {
              uVar16 = puVar27[1];
              *puVar30 = *puVar27;
              puVar30[1] = uVar16;
              puVar30 = puVar30 + 2;
              puVar27 = puVar27 + uVar22;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != _h);
      }
      uVar23 = uVar23 + 1;
      lVar19 = lVar19 + 0x10;
    } while (uVar23 != (uint)((int)uVar2 >> 1));
  }
  uVar23 = uVar22 & 0xfffffffffffffffe;
  if ((uint)uVar23 != uVar2) {
    pvVar20 = (void *)(uVar23 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)_h) {
        uVar24 = ((uint)(uVar23 >> 0x1f) & 1) + (int)uVar23;
        puVar30 = (undefined8 *)
                  ((undefined1 *)local_b8.data +
                  (long)(int)(((int)uVar24 >> 1) + ((int)uVar23 - (uVar24 & 0xfffffffe))) *
                  local_b8.cstep * local_b8.elemsize);
        uVar26 = 0;
        do {
          if (0 < iVar3) {
            puVar27 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + (long)pvVar20);
            iVar28 = iVar3;
            do {
              *puVar30 = *puVar27;
              puVar30 = puVar30 + 1;
              puVar27 = puVar27 + uVar22;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != _h);
      }
      uVar23 = uVar23 + 1;
      pvVar20 = (void *)((long)pvVar20 + 8);
    } while ((long)uVar23 < (long)uVar22);
  }
  if (0 < iVar4 >> 2) {
    local_38 = local_70->data;
    local_40 = local_70->elemsize * local_70->cstep;
    local_60 = (undefined1 (*) [16])local_b8.data;
    pauVar25 = (undefined1 (*) [16])local_68->data;
    local_48 = local_68->elemsize * local_68->cstep;
    local_50 = (ulong)(uint)(iVar4 >> 2);
    uVar23 = 0;
    do {
      puVar33 = (undefined4 *)(uVar23 * 4 * local_40 + (long)local_38);
      puVar36 = (undefined4 *)((uVar23 * 4 + 1) * local_40 + (long)local_38);
      puVar34 = (undefined4 *)((uVar23 * 4 + 2) * local_40 + (long)local_38);
      puVar29 = (undefined4 *)((uVar23 * 4 + 3) * local_40 + (long)local_38);
      if ((int)uVar2 < 2) {
        uVar26 = 0;
      }
      else {
        uVar18 = 0;
        pauVar21 = (undefined1 (*) [16])local_b8.data;
        do {
          if (0 < (int)(_h * iVar3)) {
            auVar1 = *pauVar21;
            auVar8 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            vpunpcklbw_avx(auVar1,auVar8);
            vpunpckhbw_avx(auVar1,auVar8);
            auVar1 = *pauVar25;
            auVar8 = pauVar25[1];
            auVar9 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar10 = vpcmpgtb_avx((undefined1  [16])0x0,auVar8);
            vpunpcklbw_avx(auVar1,auVar9);
            vpunpckhbw_avx(auVar1,auVar9);
            vpunpcklbw_avx(auVar8,auVar10);
            vpunpckhbw_avx(auVar8,auVar10);
            halt_baddata();
          }
          auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar12 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar9 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar13 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar14 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar10 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar11 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar15 = vpunpcklqdq_avx(auVar1,auVar12);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar12);
          auVar1 = vpaddd_avx(auVar15,auVar1);
          auVar12 = vpunpcklqdq_avx(auVar8,auVar9);
          auVar8 = vpunpckhqdq_avx(auVar8,auVar9);
          auVar8 = vpaddd_avx(auVar8,auVar12);
          auVar1 = vpaddd_avx(auVar1,auVar8);
          auVar9 = vpunpcklqdq_avx(auVar13,auVar14);
          auVar8 = vpunpckhqdq_avx(auVar13,auVar14);
          auVar8 = vpaddd_avx(auVar9,auVar8);
          auVar9 = vpunpcklqdq_avx(auVar10,auVar11);
          *puVar33 = auVar1._0_4_;
          *puVar36 = auVar1._4_4_;
          *puVar34 = auVar1._8_4_;
          *puVar29 = auVar1._12_4_;
          auVar1 = vpunpckhqdq_avx(auVar10,auVar11);
          auVar1 = vpaddd_avx(auVar1,auVar9);
          auVar1 = vpaddd_avx(auVar8,auVar1);
          puVar33[1] = auVar1._0_4_;
          puVar36[1] = auVar1._4_4_;
          puVar34[1] = auVar1._8_4_;
          puVar29[1] = auVar1._12_4_;
          puVar33 = puVar33 + 2;
          puVar36 = puVar36 + 2;
          puVar34 = puVar34 + 2;
          puVar29 = puVar29 + 2;
          uVar26 = uVar18 + 2;
          lVar19 = uVar18 + 3;
          pauVar21 = (undefined1 (*) [16])(*pauVar21 + local_b8.elemsize * local_b8.cstep);
          uVar18 = uVar26;
        } while (lVar19 < (long)uVar22);
      }
      if ((int)uVar26 < (int)uVar2) {
        do {
          if (0 < (int)(_h * iVar3)) {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)((undefined1 *)local_b8.data +
                                     (ulong)(((uint)uVar26 & 1) + ((uint)(uVar26 >> 1) & 0x7fffffff)
                                            ) * local_b8.elemsize * local_b8.cstep);
            vpmovsxbw_avx(auVar1);
            auVar1 = *pauVar25;
            auVar8 = pauVar25[1];
            auVar9 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar10 = vpcmpgtb_avx((undefined1  [16])0x0,auVar8);
            vpunpcklbw_avx(auVar1,auVar9);
            vpunpckhbw_avx(auVar1,auVar9);
            vpunpcklbw_avx(auVar8,auVar10);
            vpunpckhbw_avx(auVar8,auVar10);
            halt_baddata();
          }
          auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar10 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar9 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar11 = vpunpcklqdq_avx(auVar1,auVar10);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar10);
          auVar1 = vpaddd_avx(auVar11,auVar1);
          auVar10 = vpunpcklqdq_avx(auVar8,auVar9);
          auVar8 = vpunpckhqdq_avx(auVar8,auVar9);
          auVar8 = vpaddd_avx(auVar8,auVar10);
          auVar1 = vpaddd_avx(auVar1,auVar8);
          *puVar33 = auVar1._0_4_;
          *puVar36 = auVar1._4_4_;
          *puVar34 = auVar1._8_4_;
          *puVar29 = auVar1._12_4_;
          puVar33 = puVar33 + 1;
          puVar36 = puVar36 + 1;
          puVar34 = puVar34 + 1;
          puVar29 = puVar29 + 1;
          uVar24 = (uint)uVar26 + 1;
          uVar26 = (ulong)uVar24;
        } while (uVar24 != uVar2);
      }
      uVar23 = uVar23 + 1;
      pauVar25 = (undefined1 (*) [16])(*pauVar25 + local_48);
    } while (uVar23 != local_50);
  }
  uVar23 = uVar35 & 0xfffffffffffffffc;
  if ((int)uVar23 != iVar4) {
    pvVar20 = local_70->data;
    sVar5 = local_70->elemsize;
    sVar6 = local_70->cstep;
    pvVar7 = local_68->data;
    lVar19 = local_68->elemsize * local_68->cstep;
    do {
      puVar30 = (undefined8 *)(sVar5 * sVar6 * uVar23 + (long)pvVar20);
      uVar24 = (uint)uVar23;
      if ((int)uVar2 < 2) {
        uVar26 = 0;
      }
      else {
        uVar31 = uVar24 + 3;
        if (-1 < (int)uVar24) {
          uVar31 = uVar24;
        }
        uVar18 = 0;
        do {
          if (0 < (int)(_h * iVar3)) {
            auVar1 = *(undefined1 (*) [16])
                      ((undefined1 *)local_b8.data +
                      (uVar18 >> 1) * local_b8.elemsize * local_b8.cstep);
            auVar8 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            vpunpcklbw_avx(auVar1,auVar8);
            vpunpckhbw_avx(auVar1,auVar8);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)((int)(((int)uVar31 >> 2) + (uVar24 - (uVar31 & 0xfffffffc))) *
                                      lVar19 + (long)pvVar7);
            vpmovsxbw_avx(auVar8);
            halt_baddata();
          }
          auVar1 = vpshufd_avx((undefined1  [16])0x0,0xee);
          auVar1 = vpaddd_avx(auVar1,(undefined1  [16])0x0);
          auVar8 = vpshufd_avx((undefined1  [16])0x0,0xee);
          auVar8 = vpaddd_avx(auVar8,(undefined1  [16])0x0);
          auVar1 = vphaddd_avx(auVar1,auVar8);
          auVar1 = vpshufd_avx(auVar1,0xe8);
          *puVar30 = auVar1._0_8_;
          puVar30 = puVar30 + 1;
          uVar26 = uVar18 + 2;
          lVar37 = uVar18 + 3;
          uVar18 = uVar26;
        } while (lVar37 < (long)uVar22);
      }
      if ((int)uVar26 < (int)uVar2) {
        uVar31 = uVar24 + 3;
        if (-1 < (int)uVar24) {
          uVar31 = uVar24;
        }
        do {
          if (0 < (int)(_h * iVar3)) {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)((undefined1 *)local_b8.data +
                                     (ulong)(((uint)uVar26 & 1) + ((uint)(uVar26 >> 1) & 0x7fffffff)
                                            ) * local_b8.elemsize * local_b8.cstep);
            vpmovsxbw_avx(auVar9);
            auVar10._8_8_ = 0;
            auVar10._0_8_ =
                 *(ulong *)((int)(((int)uVar31 >> 2) + (uVar24 - (uVar31 & 0xfffffffc))) * lVar19 +
                           (long)pvVar7);
            vpmovsxbw_avx(auVar10);
            halt_baddata();
          }
          auVar1 = vphaddd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar1 = vphaddd_avx(auVar1,auVar1);
          *(int *)puVar30 = auVar1._0_4_;
          puVar30 = (undefined8 *)((long)puVar30 + 4);
          uVar32 = (uint)uVar26 + 1;
          uVar26 = (ulong)uVar32;
        } while (uVar32 != uVar2);
      }
      uVar23 = uVar23 + 1;
    } while ((long)uVar23 < (long)uVar35);
  }
  piVar17 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      local_58 = uVar35;
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_b8.data != (undefined1 (*) [16])0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}